

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O0

RC __thiscall QL_Node::IndexToOffset(QL_Node *this,int index,int *offset,int *length)

{
  int local_34;
  int i;
  int *length_local;
  int *offset_local;
  int index_local;
  QL_Node *this_local;
  
  *offset = 0;
  local_34 = 0;
  while( true ) {
    if (this->attrsInRecSize <= local_34) {
      return 0x194;
    }
    if (this->attrsInRec[local_34] == index) break;
    *offset = this->qlm->attrEntries[this->attrsInRec[local_34]].attrLength + *offset;
    local_34 = local_34 + 1;
  }
  *length = this->qlm->attrEntries[this->attrsInRec[local_34]].attrLength;
  return 0;
}

Assistant:

RC QL_Node::IndexToOffset(int index, int &offset, int &length){
  offset = 0;
  for(int i=0; i < attrsInRecSize; i++){
    if(attrsInRec[i] == index){
      length = qlm.attrEntries[attrsInRec[i]].attrLength;
      return (0);
    }
    offset += qlm.attrEntries[attrsInRec[i]].attrLength;
  }
  return (QL_ATTRNOTFOUND);
}